

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::DoClosureRegCheck(IRBuilder *this,RegSlot reg)

{
  RegSlot RVar1;
  JITTimeFunctionBody *pJVar2;
  
  if (reg == 0xffffffff) {
    return;
  }
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar1 = JITTimeFunctionBody::GetEnvReg(pJVar2);
  if (RVar1 != reg) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(pJVar2);
    if (RVar1 != reg) {
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar2);
      if (RVar1 != reg) {
        pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar1 = JITTimeFunctionBody::GetParamClosureReg(pJVar2);
        if (RVar1 != reg) {
          return;
        }
      }
    }
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
IRBuilder::DoClosureRegCheck(Js::RegSlot reg)
{
    if (reg == Js::Constants::NoRegister)
    {
        return;
    }
    if (reg == m_func->GetJITFunctionBody()->GetEnvReg() ||
        reg == m_func->GetJITFunctionBody()->GetLocalClosureReg() ||
        reg == m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg() ||
        reg == m_func->GetJITFunctionBody()->GetParamClosureReg())
    {
        Js::Throw::FatalInternalError();
    }
}